

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dtls.cpp
# Opt level: O0

int ot::commissioner::DtlsSession::DtlsTimer::GetDelay(void *aDtlsTimer)

{
  bool bVar1;
  time_point<std::chrono::_V2::system_clock,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>
  *__lhs;
  time_point<std::chrono::_V2::system_clock,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>
  local_28;
  void *local_20;
  DtlsTimer *timer;
  void *pvStack_10;
  int rval;
  void *aDtlsTimer_local;
  
  if ((*(byte *)((long)aDtlsTimer + 0xb8) & 1) == 0) {
    local_20 = aDtlsTimer;
    pvStack_10 = aDtlsTimer;
    bVar1 = Timer::IsRunning((Timer *)aDtlsTimer);
    if (bVar1) {
      __lhs = (time_point<std::chrono::_V2::system_clock,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>
               *)((long)local_20 + 0xb0);
      local_28.__d.__r = (duration)std::chrono::_V2::system_clock::now();
      bVar1 = std::chrono::operator<=(__lhs,&local_28);
      timer._4_4_ = (uint)bVar1;
    }
    else {
      timer._4_4_ = 2;
    }
  }
  else {
    timer._4_4_ = 0xffffffff;
  }
  return timer._4_4_;
}

Assistant:

int DtlsSession::DtlsTimer::GetDelay(void *aDtlsTimer)
{
    int  rval;
    auto timer = reinterpret_cast<const DtlsTimer *>(aDtlsTimer);

    if (timer->mCancelled)
    {
        rval = -1;
    }
    else if (!timer->IsRunning())
    {
        rval = 2;
    }
    else if (timer->mIntermediate <= Clock::now())
    {
        rval = 1;
    }
    else
    {
        rval = 0;
    }

    return rval;
}